

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::MarkTemp(BackwardPass *this,StackSym *sym)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x190f,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) goto LAB_003eddbc;
    *puVar4 = 0;
  }
  if (sym->m_type == TyVar) {
    pBVar1 = this->currentBlock;
    if (this->tag == BackwardPhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        if ((pBVar1->loop == (Loop *)0x0) ==
            ((pBVar1->tempObjectTracker->super_ObjectTemp).super_TempTrackerBase.
             tempTransferDependencies !=
            (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x191e,
                             "((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies())"
                             ,
                             "(block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies()"
                            );
          if (!bVar3) goto LAB_003eddbc;
          *puVar4 = 0;
        }
        TempTracker<ObjectTemp>::MarkTemp(pBVar1->tempObjectTracker,sym,this);
      }
    }
    if (this->tag == DeadStorePhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        if ((pBVar1->loop == (Loop *)0x0) ==
            ((pBVar1->tempObjectVerifyTracker->super_ObjectTempVerify).super_TempTrackerBase.
             tempTransferDependencies !=
            (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1924,
                             "((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies())"
                             ,
                             "(block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies()"
                            );
          if (!bVar3) {
LAB_003eddbc:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        TempTracker<ObjectTempVerify>::MarkTemp(pBVar1->tempObjectVerifyTracker,sym,this);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTemp(StackSym * sym)
{
    Assert(!IsCollectionPass());
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        Assert((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies());
        block->tempNumberTracker->MarkTemp(sym, this);
    }
    if (this->DoMarkTempObjects())
    {
        Assert((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies());
        block->tempObjectTracker->MarkTemp(sym, this);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        Assert((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies());
        block->tempObjectVerifyTracker->MarkTemp(sym, this);
    }
#endif
}